

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void groupConcatStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  u32 uVar2;
  sqlite3_value *psVar3;
  int iVar4;
  sqlite3_str *p;
  char *pcVar5;
  
  psVar3 = *argv;
  uVar1._0_2_ = psVar3->flags;
  uVar1._2_1_ = psVar3->enc;
  uVar1._3_1_ = psVar3->eSubtype;
  if ((0xaaaaaaaaU >> (uVar1 & 0x1f) & 1) != 0) {
    return;
  }
  if ((context->pMem->flags & 0x2000) == 0) {
    p = (sqlite3_str *)createAggContext(context,0x20);
  }
  else {
    p = (sqlite3_str *)context->pMem->z;
  }
  if (p == (sqlite3_str *)0x0) {
    return;
  }
  uVar2 = p->mxAlloc;
  p->mxAlloc = context->pOut->db->aLimit[0];
  if (uVar2 != 0) {
    if (argc == 2) {
      pcVar5 = (char *)sqlite3ValueText(argv[1],'\x01');
      iVar4 = sqlite3ValueBytes(argv[1],'\x01');
      if (pcVar5 == (char *)0x0) goto LAB_001ac23b;
    }
    else {
      iVar4 = 1;
      pcVar5 = ",";
    }
    sqlite3_str_append(p,pcVar5,iVar4);
  }
LAB_001ac23b:
  pcVar5 = (char *)sqlite3ValueText(*argv,'\x01');
  iVar4 = sqlite3ValueBytes(*argv,'\x01');
  if (pcVar5 == (char *)0x0) {
    return;
  }
  sqlite3_str_append(p,pcVar5,iVar4);
  return;
}

Assistant:

static void groupConcatStep(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *zVal;
  StrAccum *pAccum;
  const char *zSep;
  int nVal, nSep;
  assert( argc==1 || argc==2 );
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pAccum = (StrAccum*)sqlite3_aggregate_context(context, sizeof(*pAccum));

  if( pAccum ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    int firstTerm = pAccum->mxAlloc==0;
    pAccum->mxAlloc = db->aLimit[SQLITE_LIMIT_LENGTH];
    if( !firstTerm ){
      if( argc==2 ){
        zSep = (char*)sqlite3_value_text(argv[1]);
        nSep = sqlite3_value_bytes(argv[1]);
      }else{
        zSep = ",";
        nSep = 1;
      }
      if( zSep ) sqlite3_str_append(pAccum, zSep, nSep);
    }
    zVal = (char*)sqlite3_value_text(argv[0]);
    nVal = sqlite3_value_bytes(argv[0]);
    if( zVal ) sqlite3_str_append(pAccum, zVal, nVal);
  }
}